

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CopyClassExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CopyClassExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  CopyClassExpression *pCVar1;
  Expression *in_RCX;
  Type *in_RDX;
  CopyClassExpression *in_RSI;
  SourceLocation in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pCVar1 = (CopyClassExpression *)
           allocate((BumpAllocator *)in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = unaff_retaddr;
  sourceRange.startLoc = in_RDI;
  ast::CopyClassExpression::CopyClassExpression(in_RSI,in_RDX,in_RCX,sourceRange);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }